

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O0

int report_accept(socket_server *ss,socket *s,socket_message *result)

{
  uint16_t uVar1;
  int fd;
  int id_00;
  int *piVar2;
  char *pcVar3;
  socket *psVar4;
  sockaddr_all *__cp;
  char local_98 [8];
  char tmp [46];
  int sin_port;
  void *sin_addr;
  socket *ns;
  int id;
  int client_fd;
  socklen_t len;
  sockaddr_all u;
  socket_message *result_local;
  socket *s_local;
  socket_server *ss_local;
  
  id = 0x1c;
  u._20_8_ = result;
  result_local = (socket_message *)s;
  s_local = (socket *)ss;
  fd = accept(s->fd,(sockaddr *)&client_fd,(socklen_t *)&id);
  if (fd < 0) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0x18) || (piVar2 = __errno_location(), *piVar2 == 0x17)) {
      *(undefined8 *)(u._20_8_ + 8) = *(undefined8 *)result_local;
      *(undefined4 *)u._20_8_ = *(undefined4 *)&result_local[1].field_0x14;
      *(undefined4 *)(u._20_8_ + 0x10) = 0;
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      *(char **)(u._20_8_ + 0x18) = pcVar3;
      ss_local._4_4_ = -1;
    }
    else {
      ss_local._4_4_ = 0;
    }
  }
  else {
    id_00 = reserve_id((socket_server *)s_local);
    if (id_00 < 0) {
      close(fd);
      ss_local._4_4_ = 0;
    }
    else {
      socket_keepalive(fd);
      sp_nonblocking(fd);
      psVar4 = new_fd((socket_server *)s_local,id_00,fd,0,*(uintptr_t *)result_local,false);
      if (psVar4 == (socket *)0x0) {
        close(fd);
        ss_local._4_4_ = 0;
      }
      else {
        psVar4->type = 7;
        *(undefined8 *)(u._20_8_ + 8) = *(undefined8 *)result_local;
        *(undefined4 *)u._20_8_ = *(undefined4 *)&result_local[1].field_0x14;
        *(int *)(u._20_8_ + 0x10) = id_00;
        *(undefined8 *)(u._20_8_ + 0x18) = 0;
        if ((ushort)client_fd == 2) {
          __cp = (sockaddr_all *)&len;
        }
        else {
          __cp = &u;
        }
        uVar1 = ntohs(client_fd._2_2_);
        register0x00000000 = (uint)uVar1;
        pcVar3 = inet_ntop((uint)(ushort)client_fd,__cp,local_98,0x2e);
        if (pcVar3 != (char *)0x0) {
          snprintf((char *)&s_local[0x1000d].wb_size,0x80,"%s:%d",local_98,
                   (ulong)stack0xffffffffffffff9c);
          *(int64_t **)(u._20_8_ + 0x18) = &s_local[0x1000d].wb_size;
        }
        ss_local._4_4_ = 1;
      }
    }
  }
  return ss_local._4_4_;
}

Assistant:

static int
report_accept(struct socket_server *ss, struct socket *s, struct socket_message *result) {
	union sockaddr_all u;
	socklen_t len = sizeof(u);
	int client_fd = accept(s->fd, &u.s, &len);
	if (client_fd < 0) {
		if (errno == EMFILE || errno == ENFILE) {
			result->opaque = s->opaque;
			result->id = s->id;
			result->ud = 0;
			result->data = strerror(errno);
			return -1;
		} else {
			return 0;
		}
	}
	int id = reserve_id(ss);
	if (id < 0) {
		close(client_fd);
		return 0;
	}
	socket_keepalive(client_fd);
	sp_nonblocking(client_fd);
	struct socket *ns = new_fd(ss, id, client_fd, PROTOCOL_TCP, s->opaque, false);
	if (ns == NULL) {
		close(client_fd);
		return 0;
	}
	ns->type = SOCKET_TYPE_PACCEPT;
	result->opaque = s->opaque;
	result->id = s->id;
	result->ud = id;
	result->data = NULL;

	void * sin_addr = (u.s.sa_family == AF_INET) ? (void*)&u.v4.sin_addr : (void *)&u.v6.sin6_addr;
	int sin_port = ntohs((u.s.sa_family == AF_INET) ? u.v4.sin_port : u.v6.sin6_port);
	char tmp[INET6_ADDRSTRLEN];
	if (inet_ntop(u.s.sa_family, sin_addr, tmp, sizeof(tmp))) {
		snprintf(ss->buffer, sizeof(ss->buffer), "%s:%d", tmp, sin_port);
		result->data = ss->buffer;
	}

	return 1;
}